

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O2

int SUNMatZero_Band(SUNMatrix A)

{
  uint uVar1;
  long lVar2;
  SUNMatrix_ID SVar3;
  int iVar4;
  ulong uVar5;
  
  SVar3 = SUNMatGetID(A);
  iVar4 = -0x2bd;
  if (SVar3 == SUNMATRIX_BAND) {
    lVar2 = *(long *)((long)A->content + 0x18);
    uVar1 = *(uint *)((long)A->content + 0x20);
    iVar4 = 0;
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      *(undefined8 *)(lVar2 + uVar5 * 8) = 0;
    }
  }
  return iVar4;
}

Assistant:

int SUNMatZero_Band(SUNMatrix A)
{
  sunindextype i;
  realtype *Adata;

  /* Verify that A is a band matrix */
  if (SUNMatGetID(A) != SUNMATRIX_BAND)
    return SUNMAT_ILL_INPUT;

  /* Perform operation */
  Adata = SM_DATA_B(A);
  for (i=0; i<SM_LDATA_B(A); i++)
    Adata[i] = ZERO;
  return SUNMAT_SUCCESS;
}